

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

void my_serialization_example(ChArchiveOut *marchive)

{
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar1;
  double dVar2;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar3;
  int iVar4;
  _List_node_base *p_Var5;
  mapped_type *pmVar6;
  myEmployeeBoss *this;
  myEmployeeCustomConstructor *this_00;
  mapped_type *pmVar7;
  vector<double,_std::allocator<double>_> m_stlvector;
  _wrap_pair<int,_double> mpair;
  int m_int;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  shared_ptr<myEmployeeBoss> s_boss;
  ChVector<double> *mvp2;
  ChVector<double> *mvp1;
  myEmployeeBoss *a_boss;
  ChMatrixDynamic<double> m_matr_dyn;
  string m_string;
  ChVector<double> *a_vect;
  char m_text [12];
  double m_double;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  shared_ptr<myEmployeeBoss> null_boss;
  pair<int,_double> m_stlpair;
  myEmployeeBoss m_boss;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  double m_array [3];
  myEmployeeCustomConstructor *mcustomconstr;
  myEmployeeBoss *a_boss2;
  ChVector<double> *a_null_ptr;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  undefined1 local_308 [32];
  ChNameValue<myEmployeeBoss> local_2e8;
  undefined1 local_2cc [4];
  undefined1 local_2c8 [8];
  ChVector<double> **ppCStack_2c0;
  ChVector<double> **local_2b8;
  undefined1 local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2a0 [2];
  ChVector<double> *local_290;
  _Alloc_hider local_288;
  undefined1 local_280 [8];
  DenseStorage<double,__1,__1,__1,_1> local_278;
  undefined1 local_258 [32];
  undefined1 local_238 [24];
  undefined1 local_220 [8];
  undefined1 local_218 [24];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  _List_node_base local_1d0;
  undefined1 local_1c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  variable_if_dynamic<long,__1> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  scalar_constant_op<double> local_178;
  undefined8 local_168;
  variable_if_dynamic<long,__1> local_160;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  scalar_constant_op<double> local_138;
  variable_if_dynamic<long,__1> local_128;
  variable_if_dynamic<long,__1> local_120;
  scalar_constant_op<double> local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [40];
  _func_int **local_90;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  __buckets_ptr local_50;
  _func_int **pp_Stack_48;
  __node_base _Stack_40;
  double dStack_38;
  
  local_2cc = (undefined1  [4])0xffffff85;
  local_218._8_4_ = 0x676e69;
  local_218._16_8_ = 0x3fbf9acffa7eb6bf;
  local_b8._16_8_ = (__node_base_ptr)0x4030800000000000;
  local_218._0_8_ = (pointer)0x7274732074736574;
  local_258._0_8_ = (long)local_258 + 0x10;
  local_b8._0_8_ = 13.1;
  local_b8._8_8_ = 15.3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"hey! stl string","");
  local_308._16_8_ = (double *)0x0;
  local_308._0_8_ = (pointer)0x0;
  local_308._8_8_ = (double *)0x0;
  local_1c0._0_8_ = (_func_int **)0x4002666666666666;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            ((vector<double,_std::allocator<double>_> *)local_308,(iterator)0x0,(double *)local_1c0)
  ;
  local_1c0._0_8_ = (_func_int **)0x4046a66666666666;
  if (local_308._8_8_ == local_308._16_8_) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)local_308,(iterator)local_308._8_8_,
               (double *)local_1c0);
  }
  else {
    *(double *)local_308._8_8_ = 45.3;
    local_308._8_8_ = local_308._8_8_ + 8;
  }
  local_1c0._0_8_ = (_func_int **)0x40509c28f5c28f5c;
  if (local_308._8_8_ == local_308._16_8_) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)local_308,(iterator)local_308._8_8_,
               (double *)local_1c0);
  }
  else {
    *(double *)local_308._8_8_ = 66.44;
    local_308._8_8_ = local_308._8_8_ + 8;
  }
  local_200._0_8_ = local_200;
  local_1f0._0_8_ = 0;
  local_200._8_8_ = local_200._0_8_;
  p_Var5 = (_List_node_base *)operator_new(0x28);
  p_Var5[1]._M_next = (_List_node_base *)0x3ff0000000000000;
  p_Var5[1]._M_prev = (_List_node_base *)0x4000000000000000;
  p_Var5[2]._M_next = (_List_node_base *)0x4008000000000000;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  local_1f0._0_8_ = local_1f0._0_8_ + 1;
  p_Var5 = (_List_node_base *)operator_new(0x28);
  p_Var5[1]._M_next = (_List_node_base *)0x4008000000000000;
  p_Var5[1]._M_prev = (_List_node_base *)0x4010000000000000;
  p_Var5[2]._M_next = (_List_node_base *)0x4014000000000000;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  local_1f0._0_8_ = local_1f0._0_8_ + 1;
  local_1d0._M_next._0_4_ = 0x78;
  local_1d0._M_prev = (_List_node_base *)0x3fefae147ae147ae;
  local_88._M_buckets = (__buckets_ptr)((long)&local_88 + 0x30);
  local_1c0._0_4_ = 0xc;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1c0);
  *pmVar6 = 11.2;
  local_1c0._0_4_ = 0x29;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1c0);
  *pmVar6 = 44.8;
  local_1c0._0_4_ = 0x22;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1c0);
  *pmVar6 = 33.6;
  local_278.m_data = (double *)0x0;
  local_278.m_rows = 0;
  local_278.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_278,0xf,3,5);
  if ((local_278.m_cols | local_278.m_rows) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  local_1a8._8_8_ = local_278.m_rows;
  local_198.m_value = local_278.m_cols;
  local_190._8_8_ = local_278.m_rows;
  local_180._M_p = (pointer)local_278.m_cols;
  local_178.m_other = 1.0;
  local_168 = local_278.m_rows;
  local_160.m_value = local_278.m_cols;
  local_158._M_p = (pointer)0x3fe0000000000000;
  local_148._M_allocated_capacity = local_278.m_rows;
  local_148._8_8_ = local_278.m_cols;
  local_138.m_other = 10.0;
  local_128.m_value = local_278.m_rows;
  local_120.m_value = local_278.m_cols;
  local_118.m_other = 0.0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_278,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)local_1c0,(assign_op<double,_double> *)&local_108);
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_108 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_100 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_f8 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_f0 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_e8 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  local_d8._0_8_ = (__buckets_ptr)0x3fe0000000000000;
  local_d8._8_8_ = 0x3fe3333333333333;
  local_d8._16_8_ = (_Hash_node_base *)0x3fe6666666666666;
  local_1c0._0_8_ = "custom_double";
  local_1c0._8_8_ = local_218 + 0x10;
  local_1c0[0x10] = '\0';
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_e0 = dVar2 + dVar2 + -1.0;
  local_50 = (__buckets_ptr)0x3fb999999999999a;
  pp_Stack_48 = (_func_int **)0x3fc999999999999a;
  _Stack_40._M_nxt = (_Hash_node_base *)0x3fd3333333333333;
  dStack_38 = 0.4;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_1c0._8_8_ = local_2cc;
  local_1c0._0_8_ = "m_int";
  local_1c0[0x10] = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  local_1c0._8_8_ = local_b8;
  local_1c0._0_8_ = "m_array";
  local_1c0[0x10] = '\0';
  chrono::ChArchiveOut::out<double,3ul>(marchive,(ChNameValue<double[3]> *)local_1c0);
  local_1c0._8_8_ = local_218;
  local_1c0._0_8_ = "m_text";
  local_1c0[0x10] = '\0';
  chrono::ChArchiveOut::out<char,12ul>(marchive,(ChNameValue<char[12]> *)local_1c0);
  local_1c0._8_8_ = local_258;
  local_1c0._0_8_ = "m_string";
  local_1c0[0x10] = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive);
  local_1c0._0_8_ = "m_stlvector";
  local_1c0[0x10] = '\0';
  local_1c0._8_8_ =
       (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *)local_308;
  chrono::ChArchiveOut::out<double>
            (marchive,(ChNameValue<std::vector<double,_std::allocator<double>_>_> *)local_1c0);
  local_1c0._0_8_ = "m_stllist";
  local_1c0[0x10] = '\0';
  local_1c0._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_200;
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)local_1c0);
  local_2e8._name = (char *)&local_1d0;
  local_1c0._8_8_ = &local_2e8;
  local_1c0._0_8_ = "m_stlpair";
  local_1c0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::_wrap_pair<int,double>>
            (marchive,(ChNameValue<chrono::_wrap_pair<int,_double>_> *)local_1c0);
  local_1c0._8_8_ = &local_88;
  local_1c0._0_8_ = "m_stlunorderedmap";
  local_1c0[0x10] = '\0';
  chrono::ChArchiveOut::out<int,double>
            (marchive,(ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                       *)local_1c0);
  local_1c0._0_8_ = "m_matr_dyn";
  local_1c0[0x10] = '\0';
  local_1c0._8_8_ = &local_278;
  chrono::ChArchiveOut::out<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (marchive,(ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_1c0);
  local_1c0._0_8_ = "m_matr_NM";
  local_1c0[0x10] = '\0';
  local_1c0._8_8_ = (assign_op<double,_double> *)&local_108;
  chrono::ChArchiveOut::out<Eigen::Matrix<double,2,3,1,2,3>>
            (marchive,(ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_1c0);
  local_1c0._8_8_ = local_d8;
  local_1c0._0_8_ = "m_vect";
  local_1c0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)local_1c0);
  local_1c0._8_8_ = &local_50;
  local_1c0._0_8_ = "m_quaternion";
  local_1c0[0x10] = '\x01';
  chrono::ChArchiveOut::out<chrono::ChQuaternion<double>>
            (marchive,(ChNameValue<chrono::ChQuaternion<double>_> *)local_1c0);
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)local_1c0,0x35,12000.34,true);
  local_1a8._M_allocated_capacity._0_4_ = FAT;
  local_2e8._name = "m_boss";
  local_2e8._flags = '\0';
  local_2e8._value = (myEmployeeBoss *)local_1c0;
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,&local_2e8);
  local_220 = (undefined1  [8])operator_new(0x18);
  local_2e8._value = (myEmployeeBoss *)local_220;
  local_2e8._name = "a_vect";
  local_2e8._flags = '\0';
  *(_func_int **)local_220 = (_func_int *)0x3ff0000000000000;
  *(_func_int **)((long)local_220 + 8) = (_func_int *)0x4000000000000000;
  *(_func_int **)((long)local_220 + 0x10) = (_func_int *)0x4008000000000000;
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_*> *)&local_2e8);
  operator_delete((void *)local_220,0x18);
  local_2e8._value = (myEmployeeBoss *)&local_90;
  local_2e8._name = "a_null_ptr";
  local_90 = (_func_int **)0x0;
  local_2e8._flags = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_*> *)&local_2e8);
  this = (myEmployeeBoss *)operator_new(0x88);
  myEmployeeBoss::myEmployeeBoss(this,0x40,22356.0,false);
  local_2e8._value = (myEmployeeBoss *)local_280;
  (this->slave).age = 0x18;
  local_2e8._name = "a_boss";
  local_2e8._flags = '\0';
  local_280 = (undefined1  [8])this;
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,(ChNameValue<myEmployeeBoss_*> *)&local_2e8);
  local_2e8._value = (myEmployeeBoss *)(local_b8 + 0x20);
  local_2e8._name = "a_boss2";
  local_2e8._flags = '\0';
  local_b8._32_8_ = local_280;
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,(ChNameValue<myEmployeeBoss_*> *)&local_2e8);
  local_2a8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<myEmployeeBoss,std::allocator<myEmployeeBoss>>
            (a_Stack_2a0,(myEmployeeBoss **)local_2a8,(allocator<myEmployeeBoss> *)&local_2e8);
  local_2e8._name = "s_boss";
  local_2e8._flags = '\0';
  local_2e8._value = (myEmployeeBoss *)local_2a8;
  chrono::ChArchiveOut::out<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&local_2e8);
  local_238._0_8_ = local_2a8;
  local_238._8_8_ = a_Stack_2a0[0]._M_pi;
  if (a_Stack_2a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_2a0[0]._M_pi)->_M_use_count = (a_Stack_2a0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_2a0[0]._M_pi)->_M_use_count = (a_Stack_2a0[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2e8._value = (myEmployeeBoss *)local_238;
  local_2e8._name = "s_boss_b";
  local_2e8._flags = '\0';
  chrono::ChArchiveOut::out<myEmployee>
            (marchive,(ChNameValue<std::shared_ptr<myEmployee>_> *)&local_2e8);
  local_2e8._value = (myEmployeeBoss *)(local_1f0 + 8);
  local_2e8._name = "null_boss";
  local_1f0._8_8_ = 0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e8._flags = '\0';
  chrono::ChArchiveOut::out<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&local_2e8);
  this_00 = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor::myEmployeeCustomConstructor(this_00,3,40.0);
  local_2e8._value = (myEmployeeBoss *)(local_b8 + 0x18);
  local_2e8._name = "mcustomconstr";
  local_2e8._flags = '\0';
  local_b8._24_8_ = this_00;
  chrono::ChArchiveOut::out<myEmployeeCustomConstructor>
            (marchive,(ChNameValue<myEmployeeCustomConstructor_*> *)&local_2e8);
  local_2b8 = (ChVector<double> **)0x0;
  local_2c8 = (undefined1  [8])0x0;
  ppCStack_2c0 = (ChVector<double> **)0x0;
  local_288._M_p = (pointer)operator_new(0x18);
  local_288._M_p[0] = '\0';
  local_288._M_p[1] = '\0';
  local_288._M_p[2] = '\0';
  local_288._M_p[3] = '\0';
  local_288._M_p[4] = '\0';
  local_288._M_p[5] = '\0';
  local_288._M_p[6] = -0x10;
  local_288._M_p[7] = '?';
  local_288._M_p[8] = '\0';
  local_288._M_p[9] = '\0';
  local_288._M_p[10] = '\0';
  local_288._M_p[0xb] = '\0';
  local_288._M_p[0xc] = '\0';
  local_288._M_p[0xd] = '\0';
  local_288._M_p[0xe] = '\0';
  local_288._M_p[0xf] = '@';
  local_288._M_p[0x10] = '\0';
  local_288._M_p[0x11] = '\0';
  local_288._M_p[0x12] = '\0';
  local_288._M_p[0x13] = '\0';
  local_288._M_p[0x14] = '\0';
  local_288._M_p[0x15] = '\0';
  local_288._M_p[0x16] = '\b';
  local_288._M_p[0x17] = '@';
  local_290 = (ChVector<double> *)operator_new(0x18);
  local_290->m_data[0] = 7.0;
  local_290->m_data[1] = 8.0;
  local_290->m_data[2] = 7.0;
  std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>::
  _M_realloc_insert<chrono::ChVector<double>*const&>
            ((vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>> *)
             local_2c8,(iterator)0x0,(ChVector<double> **)&local_288);
  if (ppCStack_2c0 == local_2b8) {
    std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>::
    _M_realloc_insert<chrono::ChVector<double>*const&>
              ((vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>> *)
               local_2c8,(iterator)ppCStack_2c0,&local_290);
  }
  else {
    *ppCStack_2c0 = local_290;
    ppCStack_2c0 = ppCStack_2c0 + 1;
  }
  local_2e8._name = local_288._M_p;
  pmVar7 = std::__detail::
           _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&marchive->external_ptr_id,&local_2e8._name);
  *pmVar7 = 0x3e9;
  local_2e8._name = "vect_of_pointers";
  local_2e8._flags = '\0';
  local_2e8._value = (myEmployeeBoss *)local_2c8;
  chrono::ChArchiveOut::out<chrono::ChVector<double>*>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
                       *)&local_2e8);
  if (local_280 != (undefined1  [8])0x0) {
    (*((myEmployee *)local_280)->_vptr_myEmployee[1])();
  }
  if (local_2c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
  }
  if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  if (a_Stack_2a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2a0[0]._M_pi);
  }
  local_1c0._0_8_ = &PTR__myEmployeeBoss_00158370;
  local_178.m_other = (double)&PTR__myEmployee_001583a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
  }
  local_1c0._0_8_ = &PTR__myEmployee_001583a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._8_8_ != &local_190) {
    operator_delete((void *)local_1a8._8_8_,local_190._M_allocated_capacity + 1);
  }
  if (local_278.m_data != (double *)0x0) {
    free(*(void **)((long)local_278.m_data - 8));
  }
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_88);
  puVar3 = (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
            *)local_200._0_8_;
  while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar3 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_200) {
    puVar1 = *(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               **)&puVar3->_M_h;
    operator_delete(puVar3,0x28);
    puVar3 = puVar1;
  }
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
  }
  if ((undefined1 **)local_258._0_8_ != (undefined1 **)((long)local_258 + 0x10U)) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  return;
}

Assistant:

void my_serialization_example(ChArchiveOut& marchive)
{
        // All basic primitives (strings, int,etc.), plus and objects that has
        // an ArchiveOUT() function defined can be serialized in archives.      

        // Write from transient data into persistent binary file
        double m_double = 0.123456;
        int m_int = -123;
        double m_array[] = {13.1, 15.3, 16.5};
        char m_text[] = "test string"; // better use std::string
        std::string m_string = "hey! stl string";
        std::vector< double > m_stlvector; 
        m_stlvector.push_back (2.3); 
        m_stlvector.push_back (45.3);
        m_stlvector.push_back (66.44);
        std::list< ChVector<> > m_stllist; 
        m_stllist.push_back ( ChVector<>(1,2,3) ); 
        m_stllist.push_back ( ChVector<>(3,4,5) );
        std::pair<int, double> m_stlpair(120, 0.99);
        std::unordered_map<int, double> m_stlunorderedmap;
        m_stlunorderedmap[12]=11.2;
        m_stlunorderedmap[41]=44.8;
        m_stlunorderedmap[34]=33.6; 
        ChMatrixDynamic<double> m_matr_dyn(3, 5);
        m_matr_dyn.fillRandom(0, 10);
		ChMatrixNM<double,2,3> m_matr_NM;
        m_matr_NM.fillRandom(-1, +1);
        ChVector<> m_vect(0.5, 0.6, 0.7);
        ChQuaternion<> m_quat(0.1, 0.2, 0.3, 0.4);
 
        marchive << CHNVP(m_double,"custom_double");  // store data n.1      
        marchive << CHNVP(m_int);     // store data n.2 
        marchive << CHNVP(m_array);   // store data n.3
        marchive << CHNVP(m_text);    // store data n....
        marchive << CHNVP(m_string);  
        marchive << CHNVP(m_stlvector);
        marchive << CHNVP(m_stllist);
        marchive << CHNVP(m_stlpair);
        marchive << CHNVP(m_stlunorderedmap);
        marchive << CHNVP(m_matr_dyn);
		marchive << CHNVP(m_matr_NM);
        marchive << CHNVP(m_vect);
        marchive << CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);  
        
        // Also store a c++ object 
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        myEmployeeBoss m_boss(53, 12000.34, true);
        m_boss.body = FAT;
        marchive << CHNVP(m_boss);    

        // Also store a c++ objects referenced by pointer(s).
        // One could have multiple pointers to the same object: 
        // the serialization of pointers takes care of redundancy.
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        ChVector<>* a_vect = new ChVector<>(1,2,3); 
        marchive << CHNVP(a_vect);
        delete a_vect;

        // Null pointers can be serialized. They will be deserialized as null.
        ChVector<>* a_null_ptr = 0; 
        marchive << CHNVP(a_null_ptr);

        // Also store c++ objects referenced by pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded later even if we do not know if it was an object of
        // class 'myEmployee' or specialized class 'myEmployeeBoss'...
        // In order to use this feature, classes must use the CH_FACTORY_REGISTER macros, 
        // and must implement ArchiveIN() and ArchiveOUT().
        myEmployeeBoss* a_boss = new myEmployeeBoss(64, 22356, false);
        a_boss->slave.age = 24;
        marchive << CHNVP(a_boss);  //  object was referenced by pointer.

        // If another pointer shares the same object instance, you can serialize
        // it too without worrying, because the serialization system will save only
        // the first copy and following copies will just use references.

        myEmployeeBoss* a_boss2 = a_boss;
        marchive << CHNVP(a_boss2);  //  object was referenced by pointer.

        // Also store c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        auto s_boss = chrono_types::make_shared<myEmployeeBoss>();
        marchive << CHNVP(s_boss);  //  object was referenced by shared pointer.

        // Serialize a shared pointer pointing to the same shared resource of s_boss. 
        // Note, base class works fine too, as polymorphic object.
        std::shared_ptr<myEmployee> s_boss_b(s_boss);
        marchive << CHNVP(s_boss_b);

        // Serialize null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss;
        marchive << CHNVP(null_boss); 

        // Serialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = new myEmployeeCustomConstructor(3,40);
        marchive << CHNVP(mcustomconstr); 

        // Serialize an object where some pointers are un-linked as external, marking them with unique IDs
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(1,2,3);
        ChVector<>* mvp2 = new ChVector<>(7,8,7);
        vect_of_pointers.push_back(mvp1);
        vect_of_pointers.push_back(mvp2);
        // define that some object should not be serialized, but rather marked with ID for later rebinding
        marchive.UnbindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive << CHNVP(vect_of_pointers);

        delete a_boss;
}